

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void reverse_data(float *data,int datalen)

{
  float fVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)datalen;
  for (lVar3 = 0; lVar2 = lVar2 + -1, lVar3 < lVar2; lVar3 = lVar3 + 1) {
    fVar1 = data[lVar3];
    data[lVar3] = data[lVar2];
    data[lVar2] = fVar1;
  }
  return;
}

Assistant:

void
reverse_data (float *data, int datalen)
{	int left, right ;
	float temp ;

	left = 0 ;
	right = datalen - 1 ;

	while (left < right)
	{	temp = data [left] ;
		data [left] = data [right] ;
		data [right] = temp ;
		left ++ ;
		right -- ;
		} ;

}